

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType __thiscall ValueType::ToDefiniteAnyNumber(ValueType *this)

{
  bool bVar1;
  Bits BVar2;
  Bits BVar3;
  Bits local_1a;
  ValueType *pVStack_18;
  Bits numberBits;
  ValueType *this_local;
  
  pVStack_18 = this;
  BVar2 = operator|(Object,PrimitiveOrObject);
  bVar1 = OneOn(this,BVar2);
  if (bVar1) {
    BVar2 = operator|(Number,CanBeTaggedValue);
    this_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(BVar2);
  }
  else {
    BVar2 = (this->field_0).bits;
    BVar3 = operator|(Int,IntCanBeUntagged);
    BVar3 = operator|(BVar3,IntIsLikelyUntagged);
    BVar3 = operator|(BVar3,CanBeTaggedValue);
    BVar3 = operator|(BVar3,Float);
    BVar3 = operator|(BVar3,Number);
    BVar2 = ::operator&(BVar2,BVar3);
    local_1a = BVar2;
    BVar3 = operator|(Float,Number);
    BVar2 = ::operator&(BVar2,BVar3);
    bVar1 = operator!(BVar2);
    if (bVar1) {
      BVar2 = operator|(Number,CanBeTaggedValue);
      operator|=(&local_1a,BVar2);
    }
    this_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(local_1a);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)this_local._6_2_;
}

Assistant:

ValueType ValueType::ToDefiniteAnyNumber() const
{
    // Not asserting on expected value type because Conv_Num allows converting values of arbitrary types to number
    if(OneOn(Bits::Object | Bits::PrimitiveOrObject))
        return Verify(Bits::Number | Bits::CanBeTaggedValue);
    Bits numberBits =
        bits &
        (
            Bits::Int |
            Bits::IntCanBeUntagged |
            Bits::IntIsLikelyUntagged |
            Bits::CanBeTaggedValue |
            Bits::Float |
            Bits::Number
        );
    if(!(numberBits & (Bits::Float | Bits::Number)))
        numberBits |= Bits::Number | Bits::CanBeTaggedValue;
    return Verify(numberBits);
}